

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  long lVar1;
  char cVar2;
  mz_zip_internal_state *pArray;
  tdefl_compressor *d;
  size_t sVar3;
  mz_bool mVar4;
  int iVar5;
  tdefl_status tVar6;
  mz_uint32 mVar7;
  mz_uint8 mVar13;
  time_t *ptVar8;
  mz_ulong mVar9;
  mz_uint64 *pmVar10;
  size_t sVar11;
  size_t sVar12;
  sbyte sVar14;
  char *pcVar15;
  mz_uint64 *pLocal_header_ofs;
  mz_uint64 *pmVar16;
  sbyte sVar17;
  uint uVar18;
  ulong uVar19;
  mz_uint64 *pComp_size;
  mz_uint64 *pmVar20;
  ushort bit_flags;
  sbyte sVar21;
  uint uVar22;
  mz_uint64 *pmVar23;
  mz_uint8 mVar24;
  mz_uint64 *pmVar25;
  undefined1 uVar26;
  uint uVar27;
  byte bVar28;
  mz_uint32 ext_attributes;
  mz_uint64 mVar29;
  bool bVar30;
  byte local_12d;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint64 local_128;
  undefined8 local_120;
  mz_uint64 comp_size;
  tdefl_compressor *local_110;
  size_t local_108;
  size_t local_100;
  char *local_f8;
  mz_uint64 local_dir_header_ofs;
  mz_zip_writer_add_state state;
  size_t local_c0;
  mz_uint8 local_dir_header [30];
  mz_uint32 local_98;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  local_128 = pZip->m_archive_size;
  comp_size = 0;
  uVar18 = 6;
  if (-1 < (int)level_and_flags) {
    uVar18 = level_and_flags;
  }
  if ((uncomp_size == 0) && ((uVar18 >> 10 & 1) != 0 || buf_size == 0)) {
    bit_flags = 0;
  }
  else {
    bit_flags = 8;
  }
  if ((uVar18 >> 0x10 & 1) == 0) {
    bit_flags = bit_flags + 0x800;
  }
  uVar27 = uVar18 & 0xf;
  pArray = pZip->m_pState;
  if ((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_0014bdfe:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < uVar27)))) goto LAB_0014bdfe;
  if (pArray->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pArray->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
    return 0;
  }
  if (uncomp_size != 0 && (uVar18 >> 10 & 1) == 0) goto LAB_0014bdfe;
  local_120 = (mz_uint8 *)(CONCAT44(local_120._4_4_,uVar18 >> 10) & 0xffffffff00000001);
  if (*pArchive_name == '/') {
LAB_0014be38:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
      return 0;
    }
    return 0;
  }
  local_98 = uncomp_crc32;
  pmVar16 = &state.m_cur_archive_file_ofs;
  pmVar23 = &state.m_cur_archive_file_ofs;
  pmVar20 = &state.m_cur_archive_file_ofs;
  local_12d = uVar27 == 0 | (byte)local_120;
  for (pcVar15 = pArchive_name; cVar2 = *pcVar15, cVar2 != '\0'; pcVar15 = pcVar15 + 1) {
    if ((cVar2 == ':') || (cVar2 == '\\')) goto LAB_0014be38;
  }
  ptVar8 = last_modified;
  local_100 = buf_size;
  local_f8 = pArchive_name;
  local_dir_header_ofs = local_128;
  if (last_modified == (time_t *)0x0) {
    time((time_t *)local_dir_header);
    ptVar8 = (time_t *)local_dir_header;
  }
  mz_zip_time_t_to_dos_time(*ptVar8,&dos_time,&dos_date);
  sVar11 = local_100;
  if ((uVar18 >> 10 & 1) == 0) {
    mVar9 = mz_crc32(0,(mz_uint8 *)pBuf,local_100);
    local_98 = (mz_uint32)mVar9;
    uncomp_size = sVar11;
    if (sVar11 < 4) {
      uVar27 = 0;
    }
    local_12d = local_12d | sVar11 < 4;
  }
  local_108 = strlen(local_f8);
  if (0xffff < local_108) goto LAB_0014be38;
  if (pZip->m_file_offset_alignment == 0) {
    uVar18 = 0;
  }
  else {
    iVar5 = (int)pZip->m_file_offset_alignment;
    uVar18 = iVar5 - 1;
    uVar18 = iVar5 - ((uint)pZip->m_archive_size & uVar18) & uVar18;
  }
  sVar11 = (pArray->m_central_dir).m_size;
  lVar1 = comment_size + local_108;
  if (0xfffffffe < sVar11 + lVar1 + 0x4a) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
      return 0;
    }
    return 0;
  }
  if ((pArray->m_zip64 == 0) &&
     ((pZip->m_archive_size +
      (ulong)user_extra_data_central_len + (ulong)user_extra_data_len + (ulong)comment_size +
      local_108 * 2 + (ulong)uVar18 + sVar11) - 0xffffff8e < 0xffffffff00000000)) {
    pArray->m_zip64 = 1;
  }
  ext_attributes = 0;
  if (((local_108 != 0) && (local_f8[local_108 - 1] == '/')) &&
     (ext_attributes = 0x10, uncomp_size != 0 || local_100 != 0)) goto LAB_0014bdfe;
  sVar12 = sVar11 + 0x1c;
  if (pArray->m_zip64 == 0) {
    sVar12 = sVar11;
  }
  uVar19 = sVar12 + lVar1 + 0x2e;
  if ((((pArray->m_central_dir).m_capacity < uVar19) &&
      (mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar19,1), mVar4 == 0)) ||
     ((uVar19 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar19 &&
      (mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar19,1),
      mVar4 == 0)))) {
LAB_0014c170:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    return 0;
  }
  if (local_100 == 0 || local_12d != 0) {
    local_110 = (tdefl_compressor *)0x0;
  }
  else {
    local_110 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_110 == (tdefl_compressor *)0x0) goto LAB_0014c170;
  }
  mVar4 = mz_zip_writer_write_zeros(pZip,local_128,uVar18);
  if (mVar4 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + uVar18;
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                  ,0x1807,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  local_128 = local_128 + uVar18;
  local_dir_header[0x10] = '\0';
  local_dir_header[0x11] = '\0';
  local_dir_header[0x12] = '\0';
  local_dir_header[0x13] = '\0';
  local_dir_header[0x14] = '\0';
  local_dir_header[0x15] = '\0';
  local_dir_header[0x16] = '\0';
  local_dir_header[0x17] = '\0';
  local_dir_header[0x18] = '\0';
  local_dir_header[0x19] = '\0';
  local_dir_header[0x1a] = '\0';
  local_dir_header[0x1b] = '\0';
  local_dir_header[0x1c] = '\0';
  local_dir_header[0x1d] = '\0';
  local_dir_header[0] = '\0';
  local_dir_header[1] = '\0';
  local_dir_header[2] = '\0';
  local_dir_header[3] = '\0';
  local_dir_header[4] = '\0';
  local_dir_header[5] = '\0';
  local_dir_header[6] = '\0';
  local_dir_header[7] = '\0';
  local_dir_header[8] = '\0';
  local_dir_header[9] = '\0';
  local_dir_header[10] = '\0';
  local_dir_header[0xb] = '\0';
  local_dir_header[0xc] = '\0';
  local_dir_header[0xd] = '\0';
  local_dir_header[0xe] = '\0';
  local_dir_header[0xf] = '\0';
  bVar28 = local_12d ^ 1 | (byte)local_120;
  mVar13 = (mz_uint8)(bit_flags >> 8);
  mVar24 = (mz_uint8)((ushort)bVar28 << 3);
  if (pArray->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (local_128 >> 0x20 != 0)) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
        return 0;
      }
      return 0;
    }
    local_dir_header[4] = '\x14';
    if (bVar28 == 0) {
      local_dir_header[4] = '\0';
    }
    builtin_memcpy(local_dir_header,"PK\x03\x04",4);
    local_dir_header[5] = '\0';
    local_dir_header[6] = (mz_uint8)bit_flags;
    local_dir_header[7] = mVar13;
    local_dir_header[9] = '\0';
    local_dir_header[10] = (mz_uint8)dos_time;
    local_dir_header[0xb] = (mz_uint8)(dos_time >> 8);
    local_dir_header[0xc] = (mz_uint8)dos_date;
    local_dir_header[0xd] = (mz_uint8)(dos_date >> 8);
    local_dir_header[0xe] = '\0';
    local_dir_header[0xf] = '\0';
    local_dir_header[0x10] = '\0';
    local_dir_header[0x11] = '\0';
    local_dir_header[0x12] = '\0';
    local_dir_header[0x13] = '\0';
    local_dir_header[0x14] = '\0';
    local_dir_header[0x15] = '\0';
    local_dir_header._22_8_ =
         (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                         CONCAT12((char)user_extra_data_len,(short)local_108)) << 0x20;
    local_dir_header[8] = mVar24;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,local_dir_header,0x1e);
    sVar3 = local_108;
    if (sVar11 != 0x1e) goto LAB_0014c55e;
    local_128 = local_128 + 0x1e;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_128,local_f8,local_108);
    if (sVar11 != sVar3) goto LAB_0014c400;
    local_128 = local_128 + local_108;
    local_120 = (mz_uint8 *)0x0;
    local_c0 = 0;
  }
  else {
    if ((uncomp_size < 0xffffffff) && (local_dir_header_ofs < 0xffffffff)) {
      local_120 = (mz_uint8 *)0x0;
      local_c0 = 0;
    }
    else {
      pmVar25 = (mz_uint64 *)0x0;
      pmVar10 = &uncomp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar10 = pmVar25;
      }
      pComp_size = &comp_size;
      if (uncomp_size < 0xffffffff) {
        pComp_size = pmVar25;
      }
      pLocal_header_ofs = &local_dir_header_ofs;
      if (local_dir_header_ofs < 0xffffffff) {
        pLocal_header_ofs = pmVar25;
      }
      local_120 = extra_data;
      mVar7 = mz_zip_writer_create_zip64_extra_data(local_120,pmVar10,pComp_size,pLocal_header_ofs);
      local_c0 = (size_t)mVar7;
    }
    sVar3 = local_108;
    local_dir_header[4] = '\x14';
    if (bVar28 == 0) {
      local_dir_header[4] = '\0';
    }
    builtin_memcpy(local_dir_header,"PK\x03\x04",4);
    local_dir_header[5] = '\0';
    local_dir_header[6] = (mz_uint8)bit_flags;
    local_dir_header[7] = mVar13;
    local_dir_header[9] = '\0';
    local_dir_header[10] = (mz_uint8)dos_time;
    local_dir_header[0xb] = (mz_uint8)(dos_time >> 8);
    local_dir_header[0xc] = (mz_uint8)dos_date;
    local_dir_header[0xd] = (mz_uint8)(dos_date >> 8);
    iVar5 = (int)local_c0 + user_extra_data_len;
    local_dir_header[0xe] = '\0';
    local_dir_header[0xf] = '\0';
    local_dir_header[0x10] = '\0';
    local_dir_header[0x11] = '\0';
    local_dir_header[0x12] = '\0';
    local_dir_header[0x13] = '\0';
    local_dir_header[0x14] = '\0';
    local_dir_header[0x15] = '\0';
    local_dir_header._22_8_ =
         (ulong)CONCAT13((char)((uint)iVar5 >> 8),CONCAT12((char)iVar5,(short)local_108)) << 0x20;
    local_dir_header[8] = mVar24;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,local_dir_header,0x1e);
    if (sVar11 != 0x1e) goto LAB_0014c55e;
    mVar29 = local_128 + 0x1e;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar29,local_f8,sVar3);
    if (sVar11 != sVar3) {
LAB_0014c400:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
      goto LAB_0014c55e;
    }
    local_128 = mVar29 + sVar3;
    if (local_120 == (mz_uint8 *)0x0) {
      local_120 = (mz_uint8 *)0x0;
    }
    else {
      sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_128,extra_data,local_c0);
      if (sVar11 != local_c0) goto LAB_0014c55e;
      local_128 = local_128 + local_c0;
    }
  }
  if (user_extra_data_len != 0) {
    uVar19 = (ulong)user_extra_data_len;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_128,user_extra_data,uVar19);
    if (sVar11 != uVar19) goto LAB_0014c55e;
    local_128 = local_128 + uVar19;
  }
  sVar11 = local_100;
  d = local_110;
  if (local_12d == 0) {
    if (local_100 != 0) {
      state.m_cur_archive_file_ofs = local_128;
      state.m_comp_size = 0;
      uVar19 = 10;
      if (uVar27 < 10) {
        uVar19 = (ulong)uVar27;
      }
      uVar22 = (uint)(uVar27 < 4) << 0xe |
               tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar19];
      uVar18 = uVar22 | 0x80000;
      if (uVar27 != 0) {
        uVar18 = uVar22;
      }
      state.m_pZip = pZip;
      tdefl_init(local_110,mz_zip_writer_add_put_buf_callback,&state,uVar18);
      tVar6 = tdefl_compress_buffer(d,pBuf,local_100,TDEFL_FINISH);
      if (tVar6 == TDEFL_STATUS_DONE) {
        local_128 = state.m_cur_archive_file_ofs;
        comp_size = state.m_comp_size;
      }
      else {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
        }
      }
      if (tVar6 != TDEFL_STATUS_DONE) {
        return 0;
      }
    }
  }
  else {
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_128,pBuf,local_100);
    if (sVar12 != sVar11) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
LAB_0014c55e:
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
        return 0;
      }
      return 0;
    }
    local_128 = local_128 + local_100;
    comp_size = local_100;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
  mVar29 = local_128;
  if (uncomp_size == 0) goto LAB_0014c740;
  if ((bit_flags & 8) == 0) {
    __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                  ,0x1874,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  state.m_pZip = (mz_zip_archive *)
                 CONCAT17((char)(local_98 >> 0x18),
                          CONCAT16((char)(local_98 >> 0x10),
                                   CONCAT15((char)(local_98 >> 8),CONCAT14((char)local_98,0x8074b50)
                                           )));
  uVar26 = (undefined1)uncomp_size;
  if (local_120 == (mz_uint8 *)0x0) {
    if (comp_size >> 0x20 == 0) {
      pmVar10 = &state.m_cur_archive_file_ofs;
      state.m_cur_archive_file_ofs = CONCAT44(state.m_cur_archive_file_ofs._4_4_,(int)comp_size);
      sVar21 = 0x18;
      sVar17 = 0x10;
      sVar14 = 8;
      sVar11 = 0x10;
      goto LAB_0014c6d7;
    }
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    }
    bVar30 = false;
  }
  else {
    pmVar10 = &state.m_comp_size;
    state.m_cur_archive_file_ofs = comp_size;
    state.m_comp_size._0_4_ = (undefined4)uncomp_size;
    uVar26 = (undefined1)(uncomp_size >> 0x20);
    sVar11 = 0x18;
    sVar21 = 0x38;
    sVar17 = 0x30;
    sVar14 = 0x28;
    pmVar20 = &state.m_comp_size;
    pmVar23 = &state.m_comp_size;
    pmVar16 = &state.m_comp_size;
LAB_0014c6d7:
    local_78 = (undefined1 *)((long)pmVar20 + 5);
    local_80 = (undefined1 *)((long)pmVar16 + 7);
    local_88 = (undefined1 *)((long)pmVar23 + 6);
    *(undefined1 *)((long)pmVar10 + 4) = uVar26;
    *local_78 = (char)(uncomp_size >> sVar14);
    *local_88 = (char)(uncomp_size >> sVar17);
    *local_80 = (char)(uncomp_size >> sVar21);
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_128,&state,sVar11);
    bVar30 = sVar12 == sVar11;
    sVar12 = 0;
    if (bVar30) {
      sVar12 = sVar11;
    }
    local_128 = mVar29 + sVar12;
  }
  if (!bVar30) {
    return 0;
  }
LAB_0014c740:
  if (local_120 != (mz_uint8 *)0x0) {
    pmVar16 = (mz_uint64 *)0x0;
    pmVar23 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar23 = pmVar16;
    }
    pmVar20 = &comp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar20 = pmVar16;
    }
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar16 = &local_dir_header_ofs;
    }
    mVar7 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar23,pmVar20,pmVar16);
    local_c0._0_2_ = (mz_uint16)mVar7;
  }
  mVar4 = mz_zip_writer_add_to_central_dir
                    (pZip,local_f8,(mz_uint16)local_108,local_120,(mz_uint16)local_c0,pComment,
                     comment_size,uncomp_size,comp_size,local_98,(ushort)bVar28 << 3,bit_flags,
                     dos_time,dos_date,local_dir_header_ofs,ext_attributes,user_extra_data_central,
                     user_extra_data_central_len);
  if (mVar4 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = local_128;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size,
                                    mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32, MZ_TIME_T *last_modified,
                                    const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor *pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state *pState;
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL)
    {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else
    {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

	if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
	{
		uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
		uncomp_size = buf_size;
		if (uncomp_size <= 3)
		{
			level = 0;
			store_data_uncompressed = MZ_TRUE;
		}
	}

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size 
			+ MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len + 
			pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
    {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0))) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size))
    {
        if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_OBJ(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, extra_size + user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL)
        {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

	if (user_extra_data_len > 0)
	{
		if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
			return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

		cur_archive_file_ofs += user_extra_data_len;
	}

    if (store_data_uncompressed)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size)
    {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
            (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size)
    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, extra_size, pComment,
                                          comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}